

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::NotImplementedException::~NotImplementedException(NotImplementedException *this)

{
  NotImplementedException *this_local;
  
  ~NotImplementedException(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~NotImplementedException() CATCH_NOEXCEPT {}